

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O3

size_t VW_HashSpaceA(VW_HANDLE handle,char *s)

{
  size_t sVar1;
  string str;
  allocator local_59;
  undefined1 *local_58;
  long local_50;
  undefined1 local_48 [16];
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  std::__cxx11::string::string((string *)&local_38,s,&local_59);
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_38,local_38 + local_30);
  sVar1 = (**(code **)(*(long *)((long)handle + 8) + 0x200))
                    (local_58,local_58 + local_50,*(undefined4 *)((long)handle + 0x58));
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return sVar1;
}

Assistant:

VW_DLL_MEMBER size_t VW_CALLING_CONV VW_HashSpaceA(VW_HANDLE handle, const char * s)
{ vw * pointer = static_cast<vw*>(handle);
  string str(s);
  return VW::hash_space(*pointer, str);
}